

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

char * __thiscall QTableModel::index(QTableModel *this,char *__s,int __c)

{
  int iVar1;
  undefined4 in_register_00000014;
  QTableWidgetItem *pQVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QTableWidgetItem *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long local_30;
  
  pQVar2 = (QTableWidgetItem *)CONCAT44(in_register_00000014,__c);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (pQVar2 == (QTableWidgetItem *)0x0) {
    *(undefined8 *)this = 0xffffffffffffffff;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      *(undefined8 *)&this->field_0x8 = 0;
      this->prototype = (QTableWidgetItem *)0x0;
      return (char *)this;
    }
  }
  else {
    uVar3 = (ulong)pQVar2->d->id;
    if (((((long)uVar3 < 0) || (*(ulong *)(__s + 0x28) <= uVar3)) ||
        (*(QTableWidgetItem **)(*(long *)(__s + 0x20) + uVar3 * 8) != pQVar2)) &&
       (local_48 = pQVar2,
       uVar3 = QtPrivate::indexOf<QTableWidgetItem*,QTableWidgetItem*>
                         ((QList<QTableWidgetItem_*> *)(__s + 0x18),&local_48,0), (int)uVar3 == -1))
    {
      *(undefined8 *)this = 0xffffffffffffffff;
      *(undefined8 *)&this->field_0x8 = 0;
      this->prototype = (QTableWidgetItem *)0x0;
    }
    else {
      local_48 = (QTableWidgetItem *)0xffffffffffffffff;
      local_40 = 0;
      uStack_38 = 0;
      iVar1 = (**(code **)(*(long *)__s + 0x80))(__s,&local_48);
      uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
      local_48 = (QTableWidgetItem *)0xffffffffffffffff;
      local_40 = 0;
      uStack_38 = 0;
      (**(code **)(*(long *)__s + 0x80))(__s,&local_48,(long)uVar3 % (long)iVar1 & 0xffffffff);
      local_48 = (QTableWidgetItem *)0xffffffffffffffff;
      local_40 = 0;
      uStack_38 = 0;
      QAbstractTableModel::index
                ((int)this,(int)__s,(QModelIndex *)((long)uVar3 / (long)iVar1 & 0xffffffff));
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (char *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTableModel::index(const QTableWidgetItem *item) const
{
    if (!item)
        return QModelIndex();
    int i = -1;
    const int id = item->d->id;
    if (id >= 0 && id < tableItems.size() && tableItems.at(id) == item) {
        i = id;
    } else { // we need to search for the item
        i = tableItems.indexOf(const_cast<QTableWidgetItem*>(item));
        if (i == -1) // not found
            return QModelIndex();
    }
    int row = i / columnCount();
    int col = i % columnCount();
    return QAbstractTableModel::index(row, col);
}